

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeBlockReturn
          (SimplifyLocals<true,_true,_true> *this,Block *block)

{
  pointer this_00;
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference pvVar5;
  Break *pBVar6;
  reference __in;
  type *__x;
  size_type sVar7;
  Expression **ppEVar8;
  mapped_type *pmVar9;
  reference ppLVar10;
  PassOptions *pPVar11;
  Module *pMVar12;
  size_t sVar13;
  LocalSet *pLVar14;
  Expression **ppEVar15;
  Function *this_01;
  Expression *pEVar16;
  Drop *pDVar17;
  _Base_ptr *this_02;
  optional<wasm::Type> type_;
  undefined1 local_420 [12];
  Builder local_410;
  LocalSet *local_408;
  LocalSet *newLocalSet;
  uintptr_t local_3f8;
  LocalSet *local_3f0;
  LocalSet *set_1;
  Break *br_1;
  Expression **brp_1;
  Expression **breakLocalSetPointer_1;
  size_t j_2;
  Expression *value;
  Expression **blockLocalSetPointer;
  EffectAnalyzer value_1;
  EffectAnalyzer condition;
  Nop nop;
  LocalSet *otherSet;
  iterator __end4;
  iterator __begin4;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range4;
  FindAll<wasm::LocalSet> findAll;
  LocalSet *set;
  Break *br;
  Expression **brp;
  Expression **breakLocalSetPointer;
  size_t j_1;
  size_t j;
  bool inAll;
  type *_;
  type *index;
  _Self local_60;
  iterator __end0;
  iterator __begin0;
  Sinkables *__range2;
  Index sharedIndex;
  bool found;
  undefined1 local_30 [8];
  type breaks;
  Block *block_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  breaks.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)block;
  bVar1 = IString::is(&(block->name).super_IString);
  if (!bVar1) {
    return;
  }
  sVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->unoptimizableBlocks,
                     (key_type *)
                     &((breaks.
                        super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables)._M_t._M_impl
                      .super__Rb_tree_header);
  if (sVar2 != 0) {
    return;
  }
  pmVar3 = std::
           map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
           ::operator[](&this->blockBreaks,
                        (key_type *)
                        &((breaks.
                           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables)._M_t.
                         _M_impl.super__Rb_tree_header);
  std::
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ::vector((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
            *)local_30,pmVar3);
  std::
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  ::erase(&this->blockBreaks,
          (key_type *)
          &((breaks.
             super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables)._M_t._M_impl.
           super__Rb_tree_header);
  sVar4 = std::
          vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
          ::size((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                  *)local_30);
  if (sVar4 == 0) {
    sharedIndex = 1;
  }
  else {
    pvVar5 = std::
             vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
             ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                           *)local_30,0);
    pBVar6 = Expression::cast<wasm::Break>(*pvVar5->brp);
    if (pBVar6->value != (Expression *)0x0) {
      __assert_fail("!(*breaks[0].brp)->template cast<Break>()->value",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x205,
                    "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    __range2._7_1_ = 0;
    __range2._0_4_ = 0xffffffff;
    __end0 = std::
             map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             ::begin(&this->sinkables);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
         ::end(&this->sinkables);
    while (bVar1 = std::operator!=(&__end0,&local_60), bVar1) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
             ::operator*(&__end0);
      __x = std::get<0ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>
                      (__in);
      std::get<1ul,unsigned_int_const,wasm::SimplifyLocals<true,true,true>::SinkableInfo>(__in);
      bVar1 = true;
      for (j_1 = 0; sVar4 = std::
                            vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                            ::size((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                    *)local_30), j_1 < sVar4; j_1 = j_1 + 1) {
        pvVar5 = std::
                 vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                 ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                               *)local_30,j_1);
        sVar7 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::count(&pvVar5->sinkables,__x);
        if (sVar7 == 0) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        __range2._0_4_ = *__x;
        __range2._7_1_ = 1;
        break;
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>
      ::operator++(&__end0);
    }
    if ((__range2._7_1_ & 1) == 0) {
      sharedIndex = 1;
    }
    else {
      for (breakLocalSetPointer = (Expression **)0x0;
          ppEVar8 = (Expression **)
                    std::
                    vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                    ::size((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                            *)local_30), breakLocalSetPointer < ppEVar8;
          breakLocalSetPointer = (Expression **)((long)breakLocalSetPointer + 1)) {
        pvVar5 = std::
                 vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                 ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                               *)local_30,(size_type)breakLocalSetPointer);
        pmVar9 = std::
                 map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                 ::at(&pvVar5->sinkables,(key_type *)&__range2);
        ppEVar8 = pmVar9->item;
        pvVar5 = std::
                 vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                 ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                               *)local_30,(size_type)breakLocalSetPointer);
        pBVar6 = Expression::cast<wasm::Break>(*pvVar5->brp);
        findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)Expression::cast<wasm::LocalSet>(*ppEVar8);
        if (pBVar6->condition != (Expression *)0x0) {
          FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&__range4,pBVar6->condition);
          __end4 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                             ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                              &__range4);
          otherSet = (LocalSet *)
                     std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                               ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                                &__range4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                             *)&otherSet), bVar1) {
            ppLVar10 = __gnu_cxx::
                       __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                       ::operator*(&__end4);
            if (*ppLVar10 ==
                (LocalSet *)
                findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              Nop::Nop((Nop *)&condition.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
              *ppEVar8 = (Expression *)
                         &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
              ;
              pPVar11 = Pass::getPassOptions((Pass *)this);
              pMVar12 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     *)&(this->
                                        super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                        ).
                                        super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                   );
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)
                         &value_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         pPVar11,pMVar12,pBVar6->condition);
              pPVar11 = Pass::getPassOptions((Pass *)this);
              pMVar12 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     *)&(this->
                                        super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                        ).
                                        super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                   );
              EffectAnalyzer::EffectAnalyzer
                        ((EffectAnalyzer *)&blockLocalSetPointer,pPVar11,pMVar12,
                         (Expression *)
                         findAll.list.
                         super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
              *ppEVar8 = (Expression *)
                         findAll.list.
                         super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
              bVar1 = EffectAnalyzer::invalidates
                                ((EffectAnalyzer *)
                                 &value_1.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,(EffectAnalyzer *)&blockLocalSetPointer);
              if (bVar1) {
                sharedIndex = 1;
              }
              else {
                sharedIndex = 10;
              }
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&blockLocalSetPointer);
              EffectAnalyzer::~EffectAnalyzer
                        ((EffectAnalyzer *)
                         &value_1.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if (sharedIndex != 10) goto LAB_022236be;
              break;
            }
            __gnu_cxx::
            __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
            ::operator++(&__end4);
          }
          sharedIndex = 0;
LAB_022236be:
          FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)&__range4);
          if (sharedIndex != 0) goto LAB_02223af1;
        }
      }
      sVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                         ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          &((breaks.
                             super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables)._M_t.
                           _M_impl.super__Rb_tree_header._M_header._M_left);
      if (sVar13 != 0) {
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&((breaks.
                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables).
                               _M_t._M_impl.super__Rb_tree_header._M_header._M_left);
        bVar1 = Expression::is<wasm::Nop>(*ppEVar8);
        if (bVar1) {
          pmVar9 = std::
                   map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                   ::at(&this->sinkables,(key_type *)&__range2);
          value = (Expression *)pmVar9->item;
          pLVar14 = Expression::cast<wasm::LocalSet>(*(Expression **)value);
          pEVar16 = pLVar14->value;
          this_02 = &((breaks.
                       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->sinkables)._M_t._M_impl.
                     super__Rb_tree_header._M_header._M_left;
          j_2 = (size_t)pEVar16;
          sVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)this_02);
          ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)this_02,sVar13 - 1);
          *ppEVar8 = pEVar16;
          ExpressionManipulator::nop<wasm::Expression>(*(Expression **)value);
          for (breakLocalSetPointer_1 = (Expression **)0x0; ppEVar8 = breakLocalSetPointer_1,
              ppEVar15 = (Expression **)
                         std::
                         vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                         ::size((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                 *)local_30), ppEVar8 < ppEVar15;
              breakLocalSetPointer_1 = (Expression **)((long)breakLocalSetPointer_1 + 1)) {
            pvVar5 = std::
                     vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                     ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                   *)local_30,(size_type)breakLocalSetPointer_1);
            pmVar9 = std::
                     map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                     ::at(&pvVar5->sinkables,(key_type *)&__range2);
            brp_1 = pmVar9->item;
            pvVar5 = std::
                     vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                     ::operator[]((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                   *)local_30,(size_type)breakLocalSetPointer_1);
            br_1 = (Break *)pvVar5->brp;
            set_1 = (LocalSet *)
                    Expression::cast<wasm::Break>
                              (*(Expression **)
                                &(br_1->super_SpecificExpression<(wasm::Expression::Id)4>).
                                 super_Expression);
            if (((Break *)set_1)->value != (Expression *)0x0) {
              __assert_fail("!br->value",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                            ,0x25d,
                            "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                           );
            }
            pLVar14 = Expression::cast<wasm::LocalSet>(*brp_1);
            local_3f0 = pLVar14;
            if (set_1[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id
                == 0) {
              *(Expression **)
               &set_1[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression =
                   pLVar14->value;
              ExpressionManipulator::nop<wasm::LocalSet>(pLVar14);
            }
            else {
              *(LocalSet **)
               &set_1[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression =
                   pLVar14;
              this_01 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        ::getFunction((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                       *)&(this->
                                          super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                          ).
                                          super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     );
              local_3f8 = (uintptr_t)Function::getLocalType(this_01,local_3f0->index);
              LocalSet::makeTee(pLVar14,(Type)local_3f8);
              pMVar12 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     *)&(this->
                                        super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                        ).
                                        super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                   );
              pEVar16 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar12->allocator);
              *brp_1 = pEVar16;
              Break::finalize((Break *)set_1);
              pMVar12 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                        ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                     *)&(this->
                                        super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                        ).
                                        super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                   );
              Builder::Builder((Builder *)&newLocalSet,pMVar12);
              pDVar17 = Builder::makeDrop((Builder *)&newLocalSet,(Expression *)set_1);
              *(Drop **)&(br_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression
                   = pDVar17;
            }
          }
          pMVar12 = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                    ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 *)&(this->
                                    super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                    ).
                                    super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                               );
          Builder::Builder(&local_410,pMVar12);
          local_408 = Builder::makeLocalSet
                                (&local_410,(type)__range2,
                                 (Expression *)
                                 breaks.
                                 super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
          ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                           ,(Expression *)local_408);
          std::
          map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
          ::clear(&this->sinkables);
          this_00 = breaks.
                    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          this->anotherCycle = true;
          std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_420);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)local_420._0_8_;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_420[8];
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = local_420._9_3_;
          Block::finalize((Block *)this_00,type_,Unknown);
          sharedIndex = 0;
          goto LAB_02223af1;
        }
      }
      std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
                (&this->blocksToEnlarge,
                 (value_type *)
                 &breaks.
                  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sharedIndex = 1;
    }
  }
LAB_02223af1:
  std::
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ::~vector((vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
             *)local_30);
  return;
}

Assistant:

void optimizeBlockReturn(Block* block) {
    if (!block->name.is() || unoptimizableBlocks.count(block->name) > 0) {
      return;
    }
    auto breaks = std::move(blockBreaks[block->name]);
    blockBreaks.erase(block->name);
    if (breaks.size() == 0) {
      // block has no branches TODO we might optimize trivial stuff here too
      return;
    }
    // block does not already have a return value (if one break has one, they
    // all do)
    assert(!(*breaks[0].brp)->template cast<Break>()->value);
    // look for a local.set that is present in them all
    bool found = false;
    Index sharedIndex = -1;
    for (auto& [index, _] : sinkables) {
      bool inAll = true;
      for (size_t j = 0; j < breaks.size(); j++) {
        if (breaks[j].sinkables.count(index) == 0) {
          inAll = false;
          break;
        }
      }
      if (inAll) {
        sharedIndex = index;
        found = true;
        break;
      }
    }
    if (!found) {
      return;
    }
    // If one of our brs is a br_if, then we will give it a value. since
    // the value executes before the condition, it is dangerous if we are
    // moving code out of the condition,
    //  (br_if
    //   (block
    //    ..use $x..
    //    (local.set $x ..)
    //   )
    //  )
    // =>
    //  (br_if
    //   (local.tee $x ..) ;; this now affects the use!
    //   (block
    //    ..use $x..
    //   )
    //  )
    // so we must check for that.
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        // TODO: optimize
        FindAll<LocalSet> findAll(br->condition);
        for (auto* otherSet : findAll.list) {
          if (otherSet == set) {
            // the set is indeed in the condition, so we can't just move it
            // but maybe there are no effects? see if, ignoring the set
            // itself, there is any risk
            Nop nop;
            *breakLocalSetPointer = &nop;
            EffectAnalyzer condition(
              this->getPassOptions(), *this->getModule(), br->condition);
            EffectAnalyzer value(
              this->getPassOptions(), *this->getModule(), set);
            *breakLocalSetPointer = set;
            if (condition.invalidates(value)) {
              // indeed, we can't do this, stop
              return;
            }
            break; // we found set in the list, can stop now
          }
        }
      }
    }
    // Great, this local is set in them all, we can optimize!
    if (block->list.size() == 0 || !block->list.back()->is<Nop>()) {
      // We can't do this here, since we can't push to the block -
      // it would invalidate sinkable pointers. So we queue a request
      // to grow the block at the end of the turn, we'll get this next
      // cycle.
      blocksToEnlarge.push_back(block);
      return;
    }
    // move block local.set's value to the end, in return position, and nop the
    // set
    auto* blockLocalSetPointer = sinkables.at(sharedIndex).item;
    auto* value = (*blockLocalSetPointer)->template cast<LocalSet>()->value;
    block->list[block->list.size() - 1] = value;
    ExpressionManipulator::nop(*blockLocalSetPointer);
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      assert(!br->value);
      // if the break is conditional, then we must set the value here - if the
      // break is not reached, we must still have the new value in the local
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        br->value = set;
        set->makeTee(this->getFunction()->getLocalType(set->index));
        *breakLocalSetPointer =
          this->getModule()->allocator.template alloc<Nop>();
        // in addition, as this is a conditional br that now has a value, it now
        // returns a value, so it must be dropped
        br->finalize();
        *brp = Builder(*this->getModule()).makeDrop(br);
      } else {
        br->value = set->value;
        ExpressionManipulator::nop(set);
      }
    }
    // finally, create a local.set on the block itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(sharedIndex, block);
    this->replaceCurrent(newLocalSet);
    sinkables.clear();
    anotherCycle = true;
    block->finalize();
  }